

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.h
# Opt level: O0

void __thiscall uWS::Group<true>::~Group(Group<true> *this)

{
  NodeData *in_RDI;
  
  std::stack<uv_poll_s_*,_std::deque<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>_>::~stack
            ((stack<uv_poll_s_*,_std::deque<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>_> *)0x103aff)
  ;
  std::__cxx11::string::~string((string *)&in_RDI[2].field_0x58);
  std::function<void_(int)>::~function((function<void_(int)> *)0x103b21);
  std::function<void_(uWS::WebSocket<true>,_char_*,_unsigned_long)>::~function
            ((function<void_(uWS::WebSocket<true>,_char_*,_unsigned_long)> *)0x103b32);
  std::function<void_(uWS::WebSocket<true>,_char_*,_unsigned_long)>::~function
            ((function<void_(uWS::WebSocket<true>,_char_*,_unsigned_long)> *)0x103b43);
  std::function<void_(uWS::WebSocket<true>,_int,_char_*,_unsigned_long)>::~function
            ((function<void_(uWS::WebSocket<true>,_int,_char_*,_unsigned_long)> *)0x103b54);
  std::function<void_(uWS::WebSocket<true>,_char_*,_unsigned_long,_uWS::OpCode)>::~function
            ((function<void_(uWS::WebSocket<true>,_char_*,_unsigned_long,_uWS::OpCode)> *)0x103b65);
  std::function<void_(uWS::WebSocket<true>,_uWS::UpgradeInfo)>::~function
            ((function<void_(uWS::WebSocket<true>,_uWS::UpgradeInfo)> *)0x103b76);
  uS::NodeData::~NodeData(in_RDI);
  return;
}

Assistant:

struct WIN32_EXPORT Group : protected uS::NodeData {
    friend struct Hub;
    std::function<void(WebSocket<isServer>, UpgradeInfo)> connectionHandler;
    std::function<void(WebSocket<isServer>, char *message, size_t length, OpCode opCode)> messageHandler;
    std::function<void(WebSocket<isServer>, int code, char *message, size_t length)> disconnectionHandler;
    std::function<void(WebSocket<isServer>, char *, size_t)> pingHandler;
    std::function<void(WebSocket<isServer>, char *, size_t)> pongHandler;

    using errorType = typename std::conditional<isServer, int, void *>::type;
    std::function<void(errorType)> errorHandler;

    Hub *hub;
    int extensionOptions;
    uv_timer_t *timer = nullptr;
    std::string userPingMessage;

    // todo: cannot be named user, collides with parent!
    void *userData = nullptr;
    void setUserData(void *user);
    void *getUserData();
    void startAutoPing(int intervalMs, std::string userMessage = "");
    static void timerCallback(uv_timer_t *timer);

    uv_poll_t *webSocketHead = nullptr, *httpSocketHead = nullptr;
    void addWebSocket(uv_poll_t *webSocket);
    void removeWebSocket(uv_poll_t *webSocket);

    std::stack<uv_poll_t *> iterators;

protected:
    Group(int extensionOptions, Hub *hub, uS::NodeData *nodeData);
    void stopListening();

public:
    void onConnection(std::function<void(WebSocket<isServer>, UpgradeInfo ui)> handler);
    void onMessage(std::function<void(WebSocket<isServer>, char *, size_t, OpCode)> handler);
    void onDisconnection(std::function<void(WebSocket<isServer>, int code, char *message, size_t length)> handler);
    void onPing(std::function<void(WebSocket<isServer>, char *, size_t)> handler);
    void onPong(std::function<void(WebSocket<isServer>, char *, size_t)> handler);
    void onError(std::function<void(errorType)> handler);

    void broadcast(const char *message, size_t length, OpCode opCode);
    void terminate();
    void close(int code = 1000, char *message = nullptr, size_t length = 0);
    using NodeData::addAsync;

    // todo: handle nested forEachs with removeWebSocket
    template <class F>
    void forEach(const F &cb) {
        uv_poll_t *iterator = webSocketHead;
        iterators.push(iterator);
        while (iterator) {
            uv_poll_t *lastIterator = iterator;
            cb(WebSocket<isServer>(iterator));
            iterator = iterators.top();
            if (lastIterator == iterator) {
                iterator = ((uS::SocketData *) iterator->data)->next;
                iterators.top() = iterator;
            }
        }
        iterators.pop();
    }
}